

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

void hexdump(char *p,char *ref,size_t l,size_t offset)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (p == (char *)0x0) {
    logprintf("(null)\n");
    return;
  }
  if (l != 0) {
    uVar6 = 0;
    do {
      logprintf("%04x",(ulong)(uint)((int)uVar6 + (int)offset));
      bVar2 = 0x20;
      bVar3 = 0x20;
      lVar4 = 0x10;
      lVar1 = 0;
      uVar5 = uVar6;
      do {
        if (l <= uVar5) {
          uVar5 = (ulong)bVar3;
          if ((ulong)-lVar1 < 0xf || lVar1 == -0xf) {
            do {
              logprintf("%c  ",uVar5);
              uVar5 = 0x20;
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
          }
          goto LAB_001164bb;
        }
        if (ref == (char *)0x0) {
          logprintf("%c%02x",(ulong)bVar3,(ulong)(byte)p[uVar5]);
        }
        else {
          if (p[uVar5] != ref[uVar5]) {
            bVar2 = 0x5f;
          }
          logprintf("%c%02x",(ulong)bVar2);
          bVar3 = bVar2;
          if (p[uVar5] == ref[uVar5]) {
            bVar3 = 0x20;
            bVar2 = 0x20;
          }
        }
        lVar1 = lVar1 + -1;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar1 != -0x10);
      uVar5 = (ulong)bVar3;
LAB_001164bb:
      logprintf("%c",uVar5);
      lVar1 = 0x10;
      uVar5 = uVar6;
      do {
        if (l <= uVar5) break;
        if ((byte)(p[uVar5] - 0x20U) < 0x5f) {
          logprintf("%c");
        }
        else {
          logprintf(".");
        }
        uVar5 = uVar5 + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
      logprintf("\n");
      uVar6 = uVar6 + 0x10;
    } while (uVar6 < l);
  }
  return;
}

Assistant:

static void
hexdump(const char *p, const char *ref, size_t l, size_t offset)
{
	size_t i, j;
	char sep;

	if (p == NULL) {
		logprintf("(null)\n");
		return;
	}
	for(i=0; i < l; i+=16) {
		logprintf("%04x", (unsigned)(i + offset));
		sep = ' ';
		for (j = 0; j < 16 && i + j < l; j++) {
			if (ref != NULL && p[i + j] != ref[i + j])
				sep = '_';
			logprintf("%c%02x", sep, 0xff & (unsigned int)p[i+j]);
			if (ref != NULL && p[i + j] == ref[i + j])
				sep = ' ';
		}
		for (; j < 16; j++) {
			logprintf("%c  ", sep);
			sep = ' ';
		}
		logprintf("%c", sep);
		for (j=0; j < 16 && i + j < l; j++) {
			int c = p[i + j];
			if (c >= ' ' && c <= 126)
				logprintf("%c", c);
			else
				logprintf(".");
		}
		logprintf("\n");
	}
}